

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xDisassembler.c
# Opt level: O2

DecodeStatus DecodeScst5(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus extraout_EAX;
  int32_t imm;
  
  uVar1 = Val | 0xffffffe0;
  if ((Val & 0x10) == 0) {
    uVar1 = Val;
  }
  MCOperand_CreateImm0(Inst,(long)(int)uVar1);
  return extraout_EAX;
}

Assistant:

static DecodeStatus DecodeScst5(MCInst *Inst, unsigned Val,
		uint64_t Address, void *Decoder)
{
	int32_t imm;

	imm = Val;
	/* Sign extend 5 bit value */
	if(imm & (1 << (5 - 1)))
		imm |= ~((1 << 5) - 1);

	MCOperand_CreateImm0(Inst, imm);

	return MCDisassembler_Success;
}